

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  cmMakefile *this_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string add;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  string local_c0;
  char *local_a0;
  char *arch;
  string dir;
  string *path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string subdir;
  char *base_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  cmSearchPath *this_local;
  
  subdir.field_2._8_8_ = base;
  if (this->FC != (cmFindCommon *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"bin",&local_41);
    std::allocator<char>::~allocator(&local_41);
    bVar1 = std::operator==(&this->FC->CMakePathName,"INCLUDE");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_40,"include");
    }
    else {
      bVar1 = std::operator==(&this->FC->CMakePathName,"LIBRARY");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_40,"lib");
      }
      else {
        bVar1 = std::operator==(&this->FC->CMakePathName,"FRAMEWORK");
        if (bVar1) {
          std::__cxx11::string::clear();
        }
      }
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(paths);
    path = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(paths);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar1) {
      dir.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      std::__cxx11::string::string((string *)&arch,(string *)dir.field_2._8_8_);
      uVar2 = std::__cxx11::string::empty();
      if ((((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) &&
         (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 != '/')) {
        std::__cxx11::string::operator+=((string *)&arch,"/");
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"include");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"lib"), bVar1)) {
        this_00 = (this->FC->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"CMAKE_LIBRARY_ARCHITECTURE",&local_c1);
        pcVar3 = cmMakefile::GetDefinition(this_00,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        local_a0 = pcVar3;
        if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&add.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arch,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&add.field_2 + 8),"/");
          std::operator+(&local_e8,&local_108,local_a0);
          AddPathInternal(this,&local_e8,(char *)subdir.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)(add.field_2._M_local_buf + 8));
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arch,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_148,"/");
      if (bVar1) {
        AddPathInternal(this,(string *)local_148,(char *)subdir.field_2._8_8_);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"bin");
      if (bVar1) {
        std::operator+(&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arch,
                       "sbin");
        AddPathInternal(this,&local_168,(char *)subdir.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_168);
      }
      uVar2 = std::__cxx11::string::empty();
      if (((uVar2 & 1) == 0) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)dir.field_2._8_8_,"/"), bVar1)) {
        AddPathInternal(this,(string *)dir.field_2._8_8_,(char *)subdir.field_2._8_8_);
      }
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)&arch);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSearchPath.cxx"
                ,0xa4,
                "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)")
  ;
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char* base)
{
  assert(this->FC != nullptr);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE") {
    subdir = "include";
  } else if (this->FC->CMakePathName == "LIBRARY") {
    subdir = "lib";
  } else if (this->FC->CMakePathName == "FRAMEWORK") {
    subdir.clear(); // ? what to do for frameworks ?
  }

  for (std::string const& path : paths) {
    std::string dir = path;
    if (!subdir.empty() && !dir.empty() && dir.back() != '/') {
      dir += "/";
    }
    if (subdir == "include" || subdir == "lib") {
      const char* arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if (arch && *arch) {
        this->AddPathInternal(dir + subdir + "/" + arch, base);
      }
    }
    std::string add = dir + subdir;
    if (add != "/") {
      this->AddPathInternal(add, base);
    }
    if (subdir == "bin") {
      this->AddPathInternal(dir + "sbin", base);
    }
    if (!subdir.empty() && path != "/") {
      this->AddPathInternal(path, base);
    }
  }
}